

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::CoverCrossSymbol::CoverCrossSymbol
          (CoverCrossSymbol *this,Compilation *comp,string_view name,SourceLocation loc,
          span<const_slang::ast::CoverpointSymbol_*const,_18446744073709551615UL> targets)

{
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view name_06;
  string_view name_07;
  string_view name_08;
  string_view name_09;
  string_view name_10;
  LookupLocation lookupLocation;
  LookupLocation lookupLocation_00;
  string_view name_11;
  char *in_RCX;
  size_t in_RDX;
  Compilation *in_RSI;
  Symbol *in_RDI;
  SourceLocation in_R8;
  StructBuilder type_option;
  bool in_stack_0000016f;
  Scope *in_stack_00000170;
  StructBuilder option;
  LanguageVersion lv;
  Type *string_t;
  Type *int_t;
  Type *bit_t;
  size_t in_stack_fffffffffffffdd8;
  Type *in_stack_fffffffffffffde0;
  Type *fieldType;
  Compilation *in_stack_fffffffffffffde8;
  Type *this_00;
  Scope *in_stack_fffffffffffffdf0;
  bitmask<slang::ast::VariableFlags> flags;
  Type *structBuilder;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 uVar1;
  VariableLifetime in_stack_fffffffffffffdfc;
  VariableLifetime lifetime;
  Scope *in_stack_fffffffffffffe00;
  Symbol *scope;
  Type *in_stack_fffffffffffffe08;
  char *pcVar2;
  undefined1 in_stack_fffffffffffffe48 [16];
  Scope *in_stack_fffffffffffffe58;
  undefined8 in_stack_fffffffffffffe60;
  bitmask<slang::ast::VariableFlags> local_18a;
  basic_string_view<char,_std::char_traits<char>_> local_188;
  bitmask<slang::ast::VariableFlags> local_172;
  basic_string_view<char,_std::char_traits<char>_> local_170;
  undefined8 local_160;
  undefined8 local_158;
  basic_string_view<char,_std::char_traits<char>_> local_130;
  bitmask<slang::ast::VariableFlags> local_11a;
  basic_string_view<char,_std::char_traits<char>_> local_118;
  bitmask<slang::ast::VariableFlags> local_102;
  basic_string_view<char,_std::char_traits<char>_> local_100;
  bitmask<slang::ast::VariableFlags> local_ea;
  basic_string_view<char,_std::char_traits<char>_> local_e8;
  bitmask<slang::ast::VariableFlags> local_d2;
  basic_string_view<char,_std::char_traits<char>_> local_d0;
  bitmask<slang::ast::VariableFlags> local_ba;
  basic_string_view<char,_std::char_traits<char>_> local_b8;
  bitmask<slang::ast::VariableFlags> local_a2;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  undefined8 local_90;
  undefined8 local_88;
  LanguageVersion local_5c;
  Type *local_58;
  Type *local_50;
  Type *local_48;
  Compilation *local_28;
  
  pcVar2 = &stack0x00000008;
  name_11._M_str = in_RCX;
  name_11._M_len = in_RDX;
  local_28 = in_RSI;
  Symbol::Symbol(in_RDI,CoverCross,name_11,in_R8);
  Scope::Scope(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
               &in_stack_fffffffffffffde0->super_Symbol);
  in_RDI[1].originatingSyntax = *(SyntaxNode **)pcVar2;
  *(undefined8 *)(in_RDI + 2) = *(undefined8 *)(pcVar2 + 8);
  std::span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL>::span
            ((span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL> *)0x5ea3fc);
  std::optional<const_slang::ast::Expression_*>::optional
            ((optional<const_slang::ast::Expression_*> *)0x5ea40d);
  local_48 = Compilation::getBitType(local_28);
  local_50 = Compilation::getIntType(local_28);
  local_58 = Compilation::getStringType(local_28);
  local_5c = Compilation::languageVersion((Compilation *)0x5ea459);
  local_90 = LookupLocation::min;
  local_88 = DAT_00fffda0;
  lookupLocation._8_8_ = in_stack_fffffffffffffe60;
  lookupLocation.scope = in_stack_fffffffffffffe58;
  StructBuilder::StructBuilder
            (in_stack_fffffffffffffe48._8_8_,in_stack_fffffffffffffe48._0_8_,lookupLocation);
  local_a0 = sv((char *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  bitmask<slang::ast::VariableFlags>::bitmask(&local_a2,None);
  name_00._M_len._4_4_ = in_stack_fffffffffffffdfc;
  name_00._M_len._0_4_ = in_stack_fffffffffffffdf8;
  name_00._M_str = (char *)in_stack_fffffffffffffe00;
  StructBuilder::addField
            ((StructBuilder *)in_stack_fffffffffffffde8,name_00,in_stack_fffffffffffffde0,
             (bitmask<slang::ast::VariableFlags>)
             (underlying_type)((ulong)in_stack_fffffffffffffdf0 >> 0x30));
  local_b8 = sv((char *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  bitmask<slang::ast::VariableFlags>::bitmask(&local_ba,None);
  name_01._M_len._4_4_ = in_stack_fffffffffffffdfc;
  name_01._M_len._0_4_ = in_stack_fffffffffffffdf8;
  name_01._M_str = (char *)in_stack_fffffffffffffe00;
  StructBuilder::addField
            ((StructBuilder *)in_stack_fffffffffffffde8,name_01,in_stack_fffffffffffffde0,
             (bitmask<slang::ast::VariableFlags>)
             (underlying_type)((ulong)in_stack_fffffffffffffdf0 >> 0x30));
  local_d0 = sv((char *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  bitmask<slang::ast::VariableFlags>::bitmask(&local_d2,None);
  name_02._M_len._4_4_ = in_stack_fffffffffffffdfc;
  name_02._M_len._0_4_ = in_stack_fffffffffffffdf8;
  name_02._M_str = (char *)in_stack_fffffffffffffe00;
  StructBuilder::addField
            ((StructBuilder *)in_stack_fffffffffffffde8,name_02,in_stack_fffffffffffffde0,
             (bitmask<slang::ast::VariableFlags>)
             (underlying_type)((ulong)in_stack_fffffffffffffdf0 >> 0x30));
  local_e8 = sv((char *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  bitmask<slang::ast::VariableFlags>::bitmask(&local_ea,None);
  name_03._M_len._4_4_ = in_stack_fffffffffffffdfc;
  name_03._M_len._0_4_ = in_stack_fffffffffffffdf8;
  name_03._M_str = (char *)in_stack_fffffffffffffe00;
  StructBuilder::addField
            ((StructBuilder *)in_stack_fffffffffffffde8,name_03,in_stack_fffffffffffffde0,
             (bitmask<slang::ast::VariableFlags>)
             (underlying_type)((ulong)in_stack_fffffffffffffdf0 >> 0x30));
  local_100 = sv((char *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  bitmask<slang::ast::VariableFlags>::bitmask(&local_102,None);
  name_04._M_len._4_4_ = in_stack_fffffffffffffdfc;
  name_04._M_len._0_4_ = in_stack_fffffffffffffdf8;
  name_04._M_str = (char *)in_stack_fffffffffffffe00;
  StructBuilder::addField
            ((StructBuilder *)in_stack_fffffffffffffde8,name_04,in_stack_fffffffffffffde0,
             (bitmask<slang::ast::VariableFlags>)
             (underlying_type)((ulong)in_stack_fffffffffffffdf0 >> 0x30));
  if (0 < (int)local_5c) {
    local_118 = sv((char *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    in_stack_fffffffffffffe08 = local_48;
    bitmask<slang::ast::VariableFlags>::bitmask(&local_11a,ImmutableCoverageOption);
    name_05._M_len._4_4_ = in_stack_fffffffffffffdfc;
    name_05._M_len._0_4_ = in_stack_fffffffffffffdf8;
    name_05._M_str = (char *)in_stack_fffffffffffffe00;
    StructBuilder::addField
              ((StructBuilder *)in_stack_fffffffffffffde8,name_05,in_stack_fffffffffffffde0,
               (bitmask<slang::ast::VariableFlags>)
               (underlying_type)((ulong)in_stack_fffffffffffffdf0 >> 0x30));
  }
  fieldType = (Type *)(in_RDI + 1);
  local_130 = sv((char *)fieldType,in_stack_fffffffffffffdd8);
  name_09._M_str = pcVar2;
  name_09._M_len = (size_t)in_stack_fffffffffffffe08;
  addProperty(in_stack_fffffffffffffe00,name_09,in_stack_fffffffffffffdfc,
              (StructBuilder *)in_stack_fffffffffffffdf0);
  flags.m_bits = (underlying_type)((ulong)in_stack_fffffffffffffdf0 >> 0x30);
  local_160 = LookupLocation::min;
  local_158 = DAT_00fffda0;
  lookupLocation_00._8_8_ = in_stack_fffffffffffffe60;
  lookupLocation_00.scope = in_stack_fffffffffffffe58;
  StructBuilder::StructBuilder
            (in_stack_fffffffffffffe48._8_8_,in_stack_fffffffffffffe48._0_8_,lookupLocation_00);
  local_170 = sv((char *)fieldType,in_stack_fffffffffffffdd8);
  this_00 = local_50;
  bitmask<slang::ast::VariableFlags>::bitmask(&local_172,None);
  name_06._M_len._4_4_ = in_stack_fffffffffffffdfc;
  name_06._M_len._0_4_ = in_stack_fffffffffffffdf8;
  name_06._M_str = (char *)in_stack_fffffffffffffe00;
  StructBuilder::addField((StructBuilder *)this_00,name_06,fieldType,flags);
  local_188 = sv((char *)fieldType,in_stack_fffffffffffffdd8);
  structBuilder = local_50;
  bitmask<slang::ast::VariableFlags>::bitmask(&local_18a,None);
  name_07._M_len._4_4_ = in_stack_fffffffffffffdfc;
  name_07._M_len._0_4_ = in_stack_fffffffffffffdf8;
  name_07._M_str = (char *)in_stack_fffffffffffffe00;
  StructBuilder::addField
            ((StructBuilder *)this_00,name_07,fieldType,
             (bitmask<slang::ast::VariableFlags>)(underlying_type)((ulong)structBuilder >> 0x30));
  sv((char *)fieldType,in_stack_fffffffffffffdd8);
  uVar1 = SUB84(local_58,0);
  lifetime = (VariableLifetime)((ulong)local_58 >> 0x20);
  bitmask<slang::ast::VariableFlags>::bitmask
            ((bitmask<slang::ast::VariableFlags> *)&stack0xfffffffffffffe5e,None);
  name_08._M_len._4_4_ = lifetime;
  name_08._M_len._0_4_ = uVar1;
  name_08._M_str = (char *)in_stack_fffffffffffffe00;
  StructBuilder::addField
            ((StructBuilder *)this_00,name_08,fieldType,
             (bitmask<slang::ast::VariableFlags>)(underlying_type)((ulong)structBuilder >> 0x30));
  scope = in_RDI + 1;
  sv((char *)fieldType,in_stack_fffffffffffffdd8);
  name_10._M_str = pcVar2;
  name_10._M_len = (size_t)in_stack_fffffffffffffe08;
  addProperty((Scope *)scope,name_10,lifetime,(StructBuilder *)structBuilder);
  addBuiltInMethods(in_stack_00000170,in_stack_0000016f);
  return;
}

Assistant:

CoverCrossSymbol::CoverCrossSymbol(Compilation& comp, std::string_view name, SourceLocation loc,
                                   std::span<const CoverpointSymbol* const> targets) :
    Symbol(SymbolKind::CoverCross, name, loc), Scope(comp, this), targets(targets) {

    auto& bit_t = comp.getBitType();
    auto& int_t = comp.getIntType();
    auto& string_t = comp.getStringType();
    auto lv = comp.languageVersion();

    StructBuilder option(*this, LookupLocation::min);
    option.addField("weight"sv, int_t);
    option.addField("goal"sv, int_t);
    option.addField("comment"sv, string_t);
    option.addField("at_least"sv, int_t);
    option.addField("cross_num_print_missing"sv, int_t);
    if (lv >= LanguageVersion::v1800_2023)
        option.addField("cross_retain_auto_bins"sv, bit_t, VariableFlags::ImmutableCoverageOption);
    addProperty(*this, "option"sv, VariableLifetime::Automatic, option);

    StructBuilder type_option(*this, LookupLocation::min);
    type_option.addField("weight"sv, int_t);
    type_option.addField("goal"sv, int_t);
    type_option.addField("comment"sv, string_t);
    addProperty(*this, "type_option"sv, VariableLifetime::Static, type_option);

    addBuiltInMethods(*this, false);
}